

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  undefined8 in_RCX;
  long in_RDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  ucvector *in_R8;
  uchar *in_R9;
  ucvector v;
  uint error;
  size_t in_stack_ffffffffffffffa8;
  ucvector *in_stack_ffffffffffffffb0;
  ulong local_48;
  LodePNGDecompressSettings *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (*(long *)(in_R9 + 0x10) == 0) {
    ucvector_init((ucvector *)&stack0xffffffffffffffb0,(uchar *)*in_RDI,*in_RSI);
    if (in_RDX != 0) {
      ucvector_resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_48 = *in_RSI;
    }
    uVar1 = lodepng_zlib_decompressv
                      (in_R8,in_R9,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0);
    *in_RDI = in_stack_ffffffffffffffb0;
    *in_RSI = local_48;
  }
  else {
    uVar1 = (**(code **)(in_R9 + 0x10))(in_RDI,in_RSI,in_RCX,in_R8,in_R9);
    if (((uVar1 != 0) && (uVar1 = 0x6e, *(long *)(in_R9 + 8) != 0)) &&
       (*(ulong *)(in_R9 + 8) < *in_RSI)) {
      uVar1 = 0x6d;
    }
  }
  return uVar1;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  unsigned error;
  if(settings->custom_zlib) {
    error = settings->custom_zlib(out, outsize, in, insize, settings);
    if(error) {
      /*the custom zlib is allowed to have its own error codes, however, we translate it to code 110*/
      error = 110;
      /*if there's a max output size, and the custom zlib returned error, then indicate that error instead*/
      if(settings->max_output_size && *outsize > settings->max_output_size) error = 109;
    }
  } else {
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
  }
  return error;
}